

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack-utils.cpp
# Opt level: O0

bool wasm::StackUtils::mayBeUnreachable(Expression *expr)

{
  bool bVar1;
  Break *pBVar2;
  Call *pCVar3;
  CallIndirect *pCVar4;
  Expression *expr_local;
  
  bVar1 = Properties::isControlFlowStructure(expr);
  if (bVar1) {
    expr_local._7_1_ = true;
  }
  else {
    switch(expr->_id) {
    case BreakId:
      pBVar2 = Expression::cast<wasm::Break>(expr);
      expr_local._7_1_ = pBVar2->condition == (Expression *)0x0;
      break;
    case SwitchId:
    case ReturnId:
    case UnreachableId:
    case ThrowId:
    case RethrowId:
      expr_local._7_1_ = true;
      break;
    case CallId:
      pCVar3 = Expression::cast<wasm::Call>(expr);
      expr_local._7_1_ = (bool)(pCVar3->isReturn & 1);
      break;
    case CallIndirectId:
      pCVar4 = Expression::cast<wasm::CallIndirect>(expr);
      expr_local._7_1_ = (bool)(pCVar4->isReturn & 1);
      break;
    default:
      expr_local._7_1_ = false;
    }
  }
  return expr_local._7_1_;
}

Assistant:

bool mayBeUnreachable(Expression* expr) {
  if (Properties::isControlFlowStructure(expr)) {
    return true;
  }
  switch (expr->_id) {
    case Expression::Id::BreakId:
      return expr->cast<Break>()->condition == nullptr;
    case Expression::Id::CallId:
      return expr->cast<Call>()->isReturn;
    case Expression::Id::CallIndirectId:
      return expr->cast<CallIndirect>()->isReturn;
    case Expression::Id::ReturnId:
    case Expression::Id::SwitchId:
    case Expression::Id::UnreachableId:
    case Expression::Id::ThrowId:
    case Expression::Id::RethrowId:
      return true;
    default:
      return false;
  }
}